

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input)

{
  byte bVar1;
  pointer pbVar2;
  pointer pcVar3;
  size_type sVar4;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *p_Var5;
  int iVar6;
  ulong extraout_RAX;
  BadNameString *pBVar7;
  ulong uVar8;
  pointer pbVar9;
  bool bVar10;
  string name;
  string pos_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  int local_17c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  pbVar9 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_138 = (_Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
               *)__return_storage_ptr__;
  if (pbVar9 != pbVar2) {
    do {
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      pcVar3 = (pbVar9->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,pcVar3,pcVar3 + pbVar9->_M_string_length);
      sVar4 = local_1c0._M_string_length;
      if (local_1c0._M_string_length != 0) {
        if (((local_1c0._M_string_length == 1) || (*local_1c0._M_dataplus._M_p != 0x2d)) ||
           (local_1c0._M_dataplus._M_p[1] == 0x2d)) {
          if (local_1c0._M_string_length < 3) {
            bVar10 = false;
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_70,&local_1c0,0,2);
            iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_70,"--");
            bVar10 = iVar6 == 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          if (bVar10) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_50,&local_1c0,2,0xffffffffffffffff);
            get_names();
            if ((extraout_RAX & 1) != 0) {
              pBVar7 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d0,local_1c0._M_dataplus._M_p,
                         local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
              BadNameString::BadLongName(pBVar7,&local_d0);
              __cxa_throw(pBVar7,&BadNameString::typeinfo,Error::~Error);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_178,&local_1c0);
          }
          else {
            iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_1c0,"-");
            if (((iVar6 == 0) ||
                (iVar6 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&local_1c0,"--"), iVar6 == 0)) ||
               (iVar6 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_1c0,"++"), iVar6 == 0)) {
              pBVar7 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,local_1c0._M_dataplus._M_p,
                         local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
              BadNameString::ReservedName(pBVar7,&local_f0);
              __cxa_throw(pBVar7,&BadNameString::typeinfo,Error::~Error);
            }
            if (local_1a0._M_string_length != 0) {
              pBVar7 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_110,local_1c0._M_dataplus._M_p,
                         local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
              BadNameString::MultiPositionalNames(pBVar7,&local_110);
              __cxa_throw(pBVar7,&BadNameString::typeinfo,Error::~Error);
            }
            if (((local_1c0._M_string_length == 0) || (*local_1c0._M_dataplus._M_p == 0x2d)) ||
               ((byte)*local_1c0._M_dataplus._M_p < 0x22)) {
LAB_001ab298:
              pBVar7 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_130,local_1c0._M_dataplus._M_p,
                         local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
              BadNameString::BadPositionalName(pBVar7,&local_130);
              __cxa_throw(pBVar7,&BadNameString::typeinfo,Error::~Error);
            }
            uVar8 = 1;
            while (local_1c0._M_string_length != uVar8) {
              bVar1 = local_1c0._M_dataplus._M_p[uVar8];
              if ((((bVar1 == 0x3a) || (bVar1 == 0x3d)) || (bVar1 == 0x7b)) ||
                 (uVar8 = uVar8 + 1, bVar1 != 9 && bVar1 < 0x21)) goto LAB_001ab298;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(&local_1a0,&local_1c0);
          }
        }
        else {
          if ((local_1c0._M_string_length != 2) || ((byte)local_1c0._M_dataplus._M_p[1] < 0x22)) {
            pBVar7 = (BadNameString *)__cxa_allocate_exception(0x38);
            if (2 < sVar4) {
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,local_1c0._M_dataplus._M_p,
                         local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
              BadNameString::MissingDash(pBVar7,&local_90);
              __cxa_throw(pBVar7,&BadNameString::typeinfo,Error::~Error);
            }
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,local_1c0._M_dataplus._M_p,
                       local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
            BadNameString::OneCharName(pBVar7,&local_b0);
            __cxa_throw(pBVar7,&BadNameString::typeinfo,Error::~Error);
          }
          local_17c = 1;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<int,char&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158
                     ,&local_17c,local_1c0._M_dataplus._M_p + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar2);
  }
  p_Var5 = local_138;
  ::std::
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  ::
  _Tuple_impl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,void>
            (local_138,&local_158,&local_178,&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,
                    CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                             local_1a0.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  return (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)p_Var5;
}

Assistant:

CLI11_INLINE std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;
    for(std::string name : input) {
        if(name.length() == 0) {
            continue;
        }
        if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1]))
                short_names.emplace_back(1, name[1]);
            else if(name.length() > 2)
                throw BadNameString::MissingDash(name);
            else
                throw BadNameString::OneCharName(name);
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name))
                long_names.push_back(name);
            else
                throw BadNameString::BadLongName(name);
        } else if(name == "-" || name == "--" || name == "++") {
            throw BadNameString::ReservedName(name);
        } else {
            if(!pos_name.empty())
                throw BadNameString::MultiPositionalNames(name);
            if(valid_name_string(name)) {
                pos_name = name;
            } else {
                throw BadNameString::BadPositionalName(name);
            }
        }
    }
    return std::make_tuple(short_names, long_names, pos_name);
}